

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O1

int Abc_SopIsAndType(char *pSop)

{
  char *pcVar1;
  int iVar2;
  char cVar3;
  
  if ((pSop != (char *)0x0) && (cVar3 = *pSop, cVar3 != '\0')) {
    pcVar1 = pSop + 1;
    iVar2 = 0;
    do {
      iVar2 = iVar2 + (uint)(cVar3 == '\n');
      cVar3 = *pcVar1;
      pcVar1 = pcVar1 + 1;
    } while (cVar3 != '\0');
    if (iVar2 == 1) {
      do {
        cVar3 = *pSop;
        if (cVar3 == ' ') {
          return (int)(pSop[1] == '1');
        }
        pSop = pSop + 1;
      } while (cVar3 != '-');
    }
  }
  return 0;
}

Assistant:

int Abc_SopIsAndType( char * pSop )
{
    char * pCur;
    if ( Abc_SopGetCubeNum(pSop) != 1 )
        return 0;
    for ( pCur = pSop; *pCur != ' '; pCur++ )
        if ( *pCur == '-' )
            return 0;
    if ( pCur[1] != '1' )
        return 0;
    return 1;
}